

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O3

void * parseNumber(SymbolContext<char> *ctx)

{
  int iVar1;
  long lVar2;
  char *__nptr;
  undefined4 *puVar3;
  int *piVar4;
  undefined8 uVar5;
  long lVar6;
  double dVar7;
  char *local_58 [2];
  char local_48 [16];
  char *local_38;
  
  puVar3 = (undefined4 *)operator_new(0x10);
  lVar2 = ctx->symbol->start;
  lVar6 = (long)ctx->context->m_window + lVar2;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,lVar6,((int)ctx->symbol->end - (int)lVar2) + lVar6);
  __nptr = local_58[0];
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  dVar7 = strtod(__nptr,&local_38);
  if (local_38 == __nptr) {
    uVar5 = std::__throw_invalid_argument("stod");
    operator_delete(puVar3);
    _Unwind_Resume(uVar5);
  }
  if (*piVar4 == 0) {
    *piVar4 = iVar1;
  }
  else if (*piVar4 == 0x22) {
    std::__throw_out_of_range("stod");
  }
  *puVar3 = 1;
  *(double *)(puVar3 + 2) = dVar7;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return puVar3;
}

Assistant:

void *parseNumber(const SymbolContext<char>& ctx)
{
    return new JSONValue(std::stod(ctx.read()));
}